

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O1

void __thiscall V2MPlayer::Reset(V2MPlayer *this)

{
  uint8_t *puVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint8_t **ppuVar5;
  long lVar6;
  uint32_t uVar7;
  Channel *pCVar8;
  long lVar9;
  uint8_t *puVar10;
  ulong uVar11;
  
  (this->m_state).time = 0;
  (this->m_state).nexttime = 0xffffffff;
  puVar3 = (this->m_base).gptr;
  (this->m_state).gptr = puVar3;
  (this->m_state).gnr = 0;
  uVar2 = (this->m_base).gdnum;
  if ((ulong)uVar2 != 0) {
    uVar2 = (uint)CONCAT12(puVar3[uVar2 * 2],CONCAT11(puVar3[uVar2],*puVar3));
    (this->m_state).gnt = uVar2;
    (this->m_state).nexttime = uVar2;
  }
  uVar7 = (this->m_state).nexttime;
  puVar3 = &(this->m_state).chan[0].ctl[0].lastcc;
  ppuVar5 = &(this->m_base).chan[0].ctl[0].ccptr;
  lVar6 = 0;
  do {
    uVar2 = (this->m_base).chan[lVar6].notenum;
    if ((ulong)uVar2 != 0) {
      pCVar8 = (this->m_state).chan + lVar6;
      puVar10 = (this->m_base).chan[lVar6].noteptr;
      pCVar8->noteptr = puVar10;
      pCVar8->lastnte = '\0';
      pCVar8->lastvel = '\0';
      pCVar8->notenr = 0;
      uVar2 = (uint)CONCAT12(puVar10[uVar2 * 2],CONCAT11(puVar10[uVar2],*puVar10));
      pCVar8->notent = uVar2;
      if (uVar2 < uVar7) {
        (this->m_state).nexttime = uVar2;
        uVar7 = uVar2;
      }
      puVar10 = (this->m_base).chan[lVar6].pcptr;
      pCVar8->pcptr = puVar10;
      pCVar8->lastpc = '\0';
      pCVar8->pcnr = 0;
      uVar2 = (this->m_base).chan[lVar6].pcnum;
      uVar11 = (ulong)uVar2;
      if (uVar11 != 0) {
        uVar4 = (uint)CONCAT12(puVar10[uVar2 * 2],CONCAT11(puVar10[uVar11],*puVar10));
        pCVar8->pcnt = uVar4;
        if (uVar4 < uVar7) {
          (this->m_state).nexttime = uVar4;
          uVar7 = uVar4;
        }
      }
      puVar10 = (this->m_base).chan[lVar6].pbptr;
      pCVar8->pbptr = puVar10;
      pCVar8->lastpb0 = '\0';
      pCVar8->lastpb1 = '\0';
      pCVar8->pbnr = 0;
      if (uVar11 != 0) {
        uVar2 = (uint)CONCAT12(puVar10[uVar2 * 2],CONCAT11(puVar10[uVar11],*puVar10));
        pCVar8->pbnt = uVar2;
        if (uVar2 < uVar7) {
          (this->m_state).nexttime = uVar2;
          uVar7 = uVar2;
        }
      }
      lVar9 = 0;
      puVar10 = puVar3;
      do {
        puVar1 = *(uint8_t **)((long)ppuVar5 + lVar9);
        ((CC *)(puVar10 + -0x10))->ccptr = puVar1;
        *puVar10 = '\0';
        *(uint32_t *)(puVar10 + -4) = 0;
        uVar2 = *(uint *)((long)ppuVar5 + lVar9 + -8);
        if ((ulong)uVar2 != 0) {
          uVar2 = (uint)CONCAT12(puVar1[uVar2 * 2],CONCAT11(puVar1[uVar2],*puVar1));
          *(uint *)(puVar10 + -8) = uVar2;
          if (uVar2 < uVar7) {
            (this->m_state).nexttime = uVar2;
            uVar7 = uVar2;
          }
        }
        puVar10 = puVar10 + 0x18;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 0x70);
    }
    lVar6 = lVar6 + 1;
    puVar3 = puVar3 + 0xf0;
    ppuVar5 = ppuVar5 + 0x14;
  } while (lVar6 != 0x10);
  uVar7 = this->m_samplerate;
  (this->m_state).usecs = uVar7 * 5000;
  (this->m_state).num = 4;
  (this->m_state).den = 4;
  (this->m_state).tpq = 8;
  (this->m_state).bar = 0;
  (this->m_state).beat = 0;
  (this->m_state).tick = 0;
  (this->m_state).smplrem = 0;
  (this->m_state).cursmpl = 0;
  if (uVar7 != 0) {
    synthInit(this,(this->m_base).patchmap,uVar7);
    synthSetGlobals(this,(this->m_base).globals);
    synthSetLyrics(this,(this->m_base).speechptrs);
    return;
  }
  return;
}

Assistant:

void V2MPlayer::Reset()
{
    m_state.time = 0;
    m_state.nexttime = (uint32_t)-1;

    m_state.gptr = m_base.gptr;
    m_state.gnr  = 0;
    UPDATENT(m_state.gnr, m_state.gnt, m_state.gptr, m_base.gdnum);
    for (int ch = 0; ch < 16; ch++)
    {
        V2MBase::Channel &bc = m_base.chan[ch];
        PlayerState::Channel &sc = m_state.chan[ch];

        if (!bc.notenum)
            continue;
        sc.noteptr = bc.noteptr;
        sc.notenr  = sc.lastnte = sc.lastvel = 0;
        UPDATENT(sc.notenr,sc.notent, sc.noteptr, bc.notenum);
        sc.pcptr = bc.pcptr;
        sc.pcnr  = sc.lastpc=0;
        UPDATENT(sc.pcnr,sc.pcnt, sc.pcptr, bc.pcnum);
        sc.pbptr = bc.pbptr;
        sc.pbnr  = sc.lastpb0 = sc.lastpb1 = 0;
        UPDATENT(sc.pbnr,sc.pbnt, sc.pbptr, bc.pcnum);
        for (int cn = 0; cn < 7; cn++)
        {
            V2MBase::Channel::CC &bcc = bc.ctl[cn];
            PlayerState::Channel::CC &scc = sc.ctl[cn];
            scc.ccptr = bcc.ccptr;
            scc.ccnr  = scc.lastcc=0;
            UPDATENT(scc.ccnr, scc.ccnt, scc.ccptr, bcc.ccnum);
        }
    }
    m_state.usecs = 5000*m_samplerate;
    m_state.num   = 4;
    m_state.den   = 4;
    m_state.tpq   = 8;
    m_state.bar   = 0;
    m_state.beat  = 0;
    m_state.tick  = 0;
    m_state.smplrem = 0;
    m_state.cursmpl = 0;

    if (m_samplerate)
    {
        synthInit(m_synth, (void*)m_base.patchmap, m_samplerate);
        synthSetGlobals(m_synth, (void*)m_base.globals);
        synthSetLyrics(m_synth, m_base.speechptrs);
    }
}